

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  ostream *poVar2;
  socklen_t __len;
  sockaddr *__addr;
  char *pcVar3;
  double dVar4;
  allocator<char> local_831;
  string local_830;
  allocator<char> local_809;
  string local_808;
  allocator<char> local_7e1;
  string local_7e0;
  allocator<char> local_7b9;
  string local_7b8;
  allocator<char> local_791;
  string local_790;
  allocator<char> local_769;
  string local_768;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_748;
  string local_728;
  allocator<char> local_701;
  string local_700;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6e0;
  int local_6bc;
  const_iterator piStack_6b8;
  int i;
  const_iterator __end1;
  const_iterator __begin1;
  undefined4 local_6a0;
  undefined4 local_69c;
  initializer_list<int> local_698;
  initializer_list<int> *local_688;
  initializer_list<int> *__range1;
  string current_student;
  string local_658 [39];
  allocator<char> local_631;
  string local_630;
  allocator<char> local_609;
  string local_608;
  allocator<char> local_5e1;
  string local_5e0;
  allocator<char> local_5b9;
  string local_5b8;
  allocator<char> local_591;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_590;
  allocator<char> local_569;
  string local_568;
  allocator<char> local_541;
  string local_540;
  allocator<char> local_519;
  string local_518;
  allocator<char> local_4f1;
  string local_4f0;
  allocator<char> local_4c9;
  string local_4c8;
  allocator<char> local_4a1;
  string local_4a0;
  allocator<char> local_479;
  string local_478;
  allocator<char> local_451;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_450;
  allocator<char> local_429;
  string local_428;
  allocator<char> local_401;
  string local_400;
  allocator<char> local_3d9;
  string local_3d8;
  allocator<char> local_3b1;
  string local_3b0;
  allocator<char> local_389;
  string local_388;
  allocator<char> local_361;
  string local_360;
  allocator<char> local_339;
  string local_338;
  allocator<char> local_311;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  allocator<char> local_2e9;
  string local_2e8;
  allocator<char> local_2c1;
  string local_2c0;
  allocator<char> local_299;
  string local_298;
  allocator<char> local_271;
  string local_270;
  allocator<char> local_249;
  string local_248;
  allocator<char> local_221;
  string local_220;
  allocator<char> local_1f9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  allocator<char> local_1d1;
  string local_1d0;
  allocator<char> local_1a9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  allocator<char> local_181;
  string local_180;
  allocator<char> local_159;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  allocator<char> local_131;
  string local_130;
  allocator<char> local_109;
  string local_108;
  allocator<char> local_e1;
  string local_e0;
  allocator<char> local_b9;
  string local_b8;
  allocator<char> local_81;
  string local_80;
  undefined1 local_60 [8];
  db students;
  char **argv_local;
  int argc_local;
  
  students.file.filename.field_2._8_8_ = argv;
  lan::db::db((db *)local_60);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"List",&local_81);
  lan::db::declare((db *)local_60,&local_80,Array);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator(&local_81);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"Carlos",&local_b9);
  lan::db::declare((db *)local_60,&local_b8,Array);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator(&local_b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"Anna",&local_e1);
  lan::db::declare((db *)local_60,&local_e0,Array);
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator(&local_e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"Antony",&local_109);
  lan::db::declare((db *)local_60,&local_108,Array);
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::~allocator(&local_109);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_130,"List",&local_131);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"Carlos",&local_159);
  lan::db::iterate<std::__cxx11::string>((db *)local_60,&local_130,&local_158,String);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator(&local_159);
  std::__cxx11::string::~string((string *)&local_130);
  std::allocator<char>::~allocator(&local_131);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_180,"List",&local_181);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a8,"Anna",&local_1a9);
  lan::db::iterate<std::__cxx11::string>((db *)local_60,&local_180,&local_1a8,String);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::allocator<char>::~allocator(&local_1a9);
  std::__cxx11::string::~string((string *)&local_180);
  std::allocator<char>::~allocator(&local_181);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d0,"List",&local_1d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f8,"Antony",&local_1f9);
  lan::db::iterate<std::__cxx11::string>((db *)local_60,&local_1d0,&local_1f8,String);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::allocator<char>::~allocator(&local_1f9);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::allocator<char>::~allocator(&local_1d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_220,"Carlos",&local_221);
  lan::db::iterate<int>((db *)local_60,&local_220,0,Container);
  std::__cxx11::string::~string((string *)&local_220);
  std::allocator<char>::~allocator(&local_221);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_248,"Anna",&local_249);
  lan::db::iterate<int>((db *)local_60,&local_248,0,Container);
  std::__cxx11::string::~string((string *)&local_248);
  std::allocator<char>::~allocator(&local_249);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_270,"Antony",&local_271);
  lan::db::iterate<int>((db *)local_60,&local_270,0,Container);
  std::__cxx11::string::~string((string *)&local_270);
  std::allocator<char>::~allocator(&local_271);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_298,"Carlos",&local_299);
  lan::db::set_anchor((db *)local_60,&local_298,0);
  std::__cxx11::string::~string((string *)&local_298);
  std::allocator<char>::~allocator(&local_299);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2c0,"@",&local_2c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2e8,"Full_name",&local_2e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_310,"Carlos Eduard",&local_311);
  lan::db::set<std::__cxx11::string>((db *)local_60,&local_2c0,&local_2e8,&local_310,String,true);
  std::__cxx11::string::~string((string *)&local_310);
  std::allocator<char>::~allocator(&local_311);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::allocator<char>::~allocator(&local_2e9);
  std::__cxx11::string::~string((string *)&local_2c0);
  std::allocator<char>::~allocator(&local_2c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_338,"@",&local_339);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_360,"Average",&local_361);
  lan::db::set<double>((db *)local_60,&local_338,&local_360,13.0,Double,true);
  std::__cxx11::string::~string((string *)&local_360);
  std::allocator<char>::~allocator(&local_361);
  std::__cxx11::string::~string((string *)&local_338);
  std::allocator<char>::~allocator(&local_339);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_388,"@",&local_389);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3b0,"Passed",&local_3b1);
  lan::db::set<bool>((db *)local_60,&local_388,&local_3b0,true,Bool,true);
  std::__cxx11::string::~string((string *)&local_3b0);
  std::allocator<char>::~allocator(&local_3b1);
  std::__cxx11::string::~string((string *)&local_388);
  std::allocator<char>::~allocator(&local_389);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3d8,"Anna",&local_3d9);
  lan::db::set_anchor((db *)local_60,&local_3d8,0);
  std::__cxx11::string::~string((string *)&local_3d8);
  std::allocator<char>::~allocator(&local_3d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_400,"@",&local_401);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_428,"Full_name",&local_429);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_450,"Anna Cristin",&local_451)
  ;
  lan::db::set<std::__cxx11::string>((db *)local_60,&local_400,&local_428,&local_450,String,true);
  std::__cxx11::string::~string((string *)&local_450);
  std::allocator<char>::~allocator(&local_451);
  std::__cxx11::string::~string((string *)&local_428);
  std::allocator<char>::~allocator(&local_429);
  std::__cxx11::string::~string((string *)&local_400);
  std::allocator<char>::~allocator(&local_401);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_478,"@",&local_479);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4a0,"Average",&local_4a1);
  lan::db::set<double>((db *)local_60,&local_478,&local_4a0,16.0,Double,true);
  std::__cxx11::string::~string((string *)&local_4a0);
  std::allocator<char>::~allocator(&local_4a1);
  std::__cxx11::string::~string((string *)&local_478);
  std::allocator<char>::~allocator(&local_479);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4c8,"@",&local_4c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4f0,"Passed",&local_4f1);
  lan::db::set<bool>((db *)local_60,&local_4c8,&local_4f0,true,Bool,true);
  std::__cxx11::string::~string((string *)&local_4f0);
  std::allocator<char>::~allocator(&local_4f1);
  std::__cxx11::string::~string((string *)&local_4c8);
  std::allocator<char>::~allocator(&local_4c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_518,"Antony",&local_519);
  lan::db::set_anchor((db *)local_60,&local_518,0);
  std::__cxx11::string::~string((string *)&local_518);
  std::allocator<char>::~allocator(&local_519);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_540,"@",&local_541);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_568,"Full_name",&local_569);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_590,"Antony Jeff",&local_591);
  lan::db::set<std::__cxx11::string>((db *)local_60,&local_540,&local_568,&local_590,String,true);
  std::__cxx11::string::~string((string *)&local_590);
  std::allocator<char>::~allocator(&local_591);
  std::__cxx11::string::~string((string *)&local_568);
  std::allocator<char>::~allocator(&local_569);
  std::__cxx11::string::~string((string *)&local_540);
  std::allocator<char>::~allocator(&local_541);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_5b8,"@",&local_5b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_5e0,"Average",&local_5e1);
  lan::db::set<double>((db *)local_60,&local_5b8,&local_5e0,9.0,Double,true);
  std::__cxx11::string::~string((string *)&local_5e0);
  std::allocator<char>::~allocator(&local_5e1);
  std::__cxx11::string::~string((string *)&local_5b8);
  std::allocator<char>::~allocator(&local_5b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_608,"@",&local_609);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_630,"Passed",&local_631);
  __len = 0;
  lan::db::set<bool>((db *)local_60,&local_608,&local_630,false,Bool,true);
  std::__cxx11::string::~string((string *)&local_630);
  std::allocator<char>::~allocator(&local_631);
  std::__cxx11::string::~string((string *)&local_608);
  std::allocator<char>::~allocator(&local_609);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_658,"generated_example.ldb",
             (allocator<char> *)(current_student.field_2._M_local_buf + 0xf));
  lan::db::connect((db *)local_60,(int)local_658,__addr,__len);
  std::__cxx11::string::~string(local_658);
  std::allocator<char>::~allocator((allocator<char> *)(current_student.field_2._M_local_buf + 0xf));
  poVar2 = std::operator<<((ostream *)&std::cout,"Landia::db version: ");
  poVar2 = std::operator<<(poVar2,(string *)lan::db_version_abi_cxx11_);
  std::operator<<(poVar2,"; Hello world!\n");
  std::__cxx11::string::string((string *)&__range1);
  __begin1._4_4_ = 0;
  local_6a0 = 1;
  local_69c = 2;
  local_698._M_array = (iterator)((long)&__begin1 + 4);
  local_698._M_len = 3;
  local_688 = &local_698;
  __end1 = std::initializer_list<int>::begin(local_688);
  piStack_6b8 = std::initializer_list<int>::end(local_688);
  for (; __end1 != piStack_6b8; __end1 = __end1 + 1) {
    local_6bc = *__end1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_700,"List",&local_701);
    lan::db::get<std::__cxx11::string>(&local_6e0,(db *)local_60,&local_700,(long)local_6bc,String);
    std::__cxx11::string::operator=((string *)&__range1,(string *)&local_6e0);
    std::__cxx11::string::~string((string *)&local_6e0);
    std::__cxx11::string::~string((string *)&local_700);
    std::allocator<char>::~allocator(&local_701);
    std::__cxx11::string::string((string *)&local_728,(string *)&__range1);
    lan::db::set_anchor((db *)local_60,&local_728,0);
    std::__cxx11::string::~string((string *)&local_728);
    poVar2 = std::operator<<((ostream *)&std::cout,"info: Printing description for student <");
    poVar2 = std::operator<<(poVar2,(string *)&__range1);
    poVar2 = std::operator<<(poVar2,">");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_6bc + 1);
    poVar2 = std::operator<<(poVar2,".\tName: ");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_768,"@",&local_769);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_790,"Full_name",&local_791);
    lan::db::get<std::__cxx11::string>(&local_748,(db *)local_60,&local_768,&local_790,String);
    poVar2 = std::operator<<(poVar2,(string *)&local_748);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<(poVar2,"\tAverage : ");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_7b8,"@",&local_7b9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_7e0,"Average",&local_7e1);
    dVar4 = lan::db::get<double>((db *)local_60,&local_7b8,&local_7e0,Double);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,dVar4);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<(poVar2,"\tPassed : ");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_808,"@",&local_809);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_830,"Passed",&local_831);
    bVar1 = lan::db::get<bool>((db *)local_60,&local_808,&local_830,Bool);
    pcVar3 = "No";
    if (bVar1) {
      pcVar3 = "Yes";
    }
    poVar2 = std::operator<<(poVar2,pcVar3);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_830);
    std::allocator<char>::~allocator(&local_831);
    std::__cxx11::string::~string((string *)&local_808);
    std::allocator<char>::~allocator(&local_809);
    std::__cxx11::string::~string((string *)&local_7e0);
    std::allocator<char>::~allocator(&local_7e1);
    std::__cxx11::string::~string((string *)&local_7b8);
    std::allocator<char>::~allocator(&local_7b9);
    std::__cxx11::string::~string((string *)&local_748);
    std::__cxx11::string::~string((string *)&local_790);
    std::allocator<char>::~allocator(&local_791);
    std::__cxx11::string::~string((string *)&local_768);
    std::allocator<char>::~allocator(&local_769);
  }
  lan::db::push((db *)local_60);
  std::__cxx11::string::~string((string *)&__range1);
  lan::db::~db((db *)local_60);
  return 0;
}

Assistant:

int main (int argc, const char * argv []) {
    
    lan::db students;
    
    students.declare("List", lan::Array);
    students.declare("Carlos", lan::Array);
    students.declare("Anna", lan::Array);
    students.declare("Antony", lan::Array);
    
    students.iterate<std::string>("List", "Carlos", lan::String);
    students.iterate<std::string>("List", "Anna", lan::String);
    students.iterate<std::string>("List", "Antony", lan::String);
    
    students.iterate("Carlos", 0, lan::Container);
    students.iterate("Anna", 0, lan::Container);
    students.iterate("Antony", 0, lan::Container);
    
    students.set_anchor("Carlos", 0);
    
    students.set<std::string>("@", "Full_name", "Carlos Eduard" ,lan::String, true);
    students.set<double>("@", "Average", 13 ,lan::Double, true);
    students.set<bool>("@", "Passed", true ,lan::Bool, true);
    
    students.set_anchor("Anna", 0);
    
    students.set<std::string>("@", "Full_name", "Anna Cristin" ,lan::String, true);
    students.set<double>("@", "Average", 16 ,lan::Double, true);
    students.set<bool>("@", "Passed", true ,lan::Bool, true);
    
    students.set_anchor("Antony", 0);
    
    students.set<std::string>("@", "Full_name", "Antony Jeff" ,lan::String, true);
    students.set<double>("@", "Average", 9 ,lan::Double, true);
    students.set<bool>("@", "Passed", false ,lan::Bool, true);
    
    students.connect("generated_example.ldb");
        
    // students.print();
    
    std::cout << "Landia::db version: " << lan::db_version << "; Hello world!\n";
    
    std::string current_student;
    
    for( auto i : { 0, 1, 2}){
                current_student = students.get<std::string>("List", i, lan::String);
                students.set_anchor(current_student, 0);
                std::cout << "info: Printing description for student <" << current_student << ">"
                << std::endl
                << i + 1 <<".\tName: " << students.get<std::string>("@", "Full_name", lan::String) 
                << std::endl
                << "\tAverage : " <<  students.get<double>("@", "Average", lan::Double)
                << std::endl
                << "\tPassed : " <<  ((students.get<bool>("@", "Passed", lan::Bool) ? "Yes" : "No"))
                << std::endl;
        }
    
    students.push();
    
}